

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

void emitASMArray(vector<unsigned_char,_std::allocator<unsigned_char>_> *data,string *name,
                 ostream *os)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  size_type sVar4;
  void *pvVar5;
  byte *pbVar6;
  ulong local_28;
  size_t i;
  ostream *os_local;
  string *name_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  
  poVar3 = std::operator<<(os,(string *)name);
  std::operator<<(poVar3,":");
  local_28 = 0;
  while( true ) {
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(data);
    if (sVar4 <= local_28) break;
    if ((local_28 & 0xf) == 0) {
      std::operator<<(os,"\n\tDB ");
    }
    poVar3 = std::operator<<(os,"$");
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    _Var2 = std::setw(2);
    poVar3 = std::operator<<(poVar3,_Var2);
    pvVar5 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar5 = (void *)std::ostream::operator<<(pvVar5,std::uppercase);
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](data,local_28);
    std::ostream::operator<<(pvVar5,(uint)*pbVar6);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(data);
    if (local_28 != sVar4 - 1) {
      std::operator<<(os,", ");
    }
    local_28 = local_28 + 1;
  }
  std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void emitASMArray(
	const std::vector<unsigned char> &data,
	const std::string &name,
	std::ostream &os
) {
	os << name << ":";
	for(size_t i = 0; i < data.size(); ++i) {
		if(i % 16 == 0) os << "\n\tDB ";
		os << "$" << std::setfill('0') << std::setw(2) << std::hex << std::uppercase << (int)data[i];
		if(i != data.size()-1) os << ", ";
	}
	os << std::endl;
}